

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O1

int Llb_ManTracePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pPivot)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  
  iVar3 = 0;
  if (pObj->TravId != p->nTravIds + -1) {
    if (pObj->TravId == p->nTravIds) {
      iVar3 = 1;
    }
    else {
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((((uVar2 & 7) != 3) ||
          ((iVar3 = 0, (pObj->field_0).CioId < p->nTruePos && (p->nTruePos <= (pObj->field_0).CioId)
           ))) && (iVar3 = 1, pObj != pPivot)) {
        uVar2 = uVar2 & 7;
        if ((1 < uVar2 - 5) && (uVar2 != 2)) {
          __assert_fail("Aig_ObjIsCand(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Pivot.c"
                        ,0x3b,"int Llb_ManTracePaths_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Pivot.c"
                        ,0x3c,"int Llb_ManTracePaths_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0) {
          uVar6 = 0;
          uVar2 = 0xffffffff;
          do {
            if (uVar6 == 0) {
              if (p->nFansAlloc <= pObj->Id) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar3 = pObj->Id * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar2 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar3 = ((int)uVar2 >> 1) * 5 + (uVar2 & 1) + 3;
            }
            pVVar1 = p->vObjs;
            uVar2 = p->pFanData[iVar3];
            if (pVVar1 == (Vec_Ptr_t *)0x0) {
              pObj_00 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar4 = (int)uVar2 >> 1;
              if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar4];
            }
            iVar3 = Llb_ManTracePaths_rec(p,pObj_00,pPivot);
            if (iVar3 == 0) {
              iVar5 = p->nTravIds + -1;
              iVar3 = 0;
              goto LAB_0081c820;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < *(uint *)&pObj->field_0x18 >> 6);
        }
        iVar5 = p->nTravIds;
        iVar3 = 1;
LAB_0081c820:
        pObj->TravId = iVar5;
      }
    }
  }
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManTracePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pFanout;
    int k, iFan = -1;
    if ( Aig_ObjIsTravIdPrevious(p, pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    if ( Saig_ObjIsLi(p, pObj) )
        return 0;
    if ( Saig_ObjIsPo(p, pObj) )
        return 0;
    if ( pObj == pPivot )
        return 1;
    assert( Aig_ObjIsCand(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFan, k )
        if ( !Llb_ManTracePaths_rec( p, pFanout, pPivot ) )
        {
            Aig_ObjSetTravIdPrevious(p, pObj);
            return 0;
        }
    Aig_ObjSetTravIdCurrent(p, pObj);
    return 1;
}